

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

int __thiscall gdsForge::gdsCopyFile(gdsForge *this,string *fileName)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ushort *puVar5;
  void *__ptr;
  iterator iVar6;
  int *arrInt;
  uint uVar7;
  byte bVar8;
  uint8_t i;
  ushort uVar9;
  ulong uVar10;
  string strName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream gdsFileIn;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Copying GDS binaries from \"");
  poVar4 = std::operator<<(poVar4,(string *)fileName);
  poVar4 = std::operator<<(poVar4,"\"");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ifstream::ifstream((string *)&gdsFileIn);
  std::ifstream::open((string *)&gdsFileIn,(_Ios_Openmode)fileName);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"FAILED to open GDS file \"");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    poVar4 = std::operator<<(poVar4,"\"");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = 1;
  }
  else {
    strName._M_dataplus._M_p = (pointer)&strName.field_2;
    strName._M_string_length = 0;
    strName.field_2._M_local_buf[0] = '\0';
    if (gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_);
      if (iVar3 != 0) {
        gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
        super__Rb_tree_header._M_header._M_color = _S_red;
        gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
        super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
        super__Rb_tree_header._M_header._M_left =
             &gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
              super__Rb_tree_header._M_header;
        gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
        super__Rb_tree_header._M_header._M_right =
             &gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
              super__Rb_tree_header._M_header;
        gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
        super__Rb_tree_header._M_node_count = 0;
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_);
      }
    }
    std::istream::seekg((long)&gdsFileIn,_S_beg);
    bVar1 = true;
    bVar8 = 0;
    do {
      puVar5 = (ushort *)operator_new__(2);
      std::istream::read((char *)&gdsFileIn,(long)puVar5);
      uVar9 = *puVar5;
      std::istream::seekg((long)&gdsFileIn,~_S_cur);
      uVar7 = (uint)(ushort)(uVar9 << 8 | uVar9 >> 8);
      __ptr = operator_new__((ulong)uVar7);
      std::istream::read((char *)&gdsFileIn,(long)__ptr);
      uVar9 = *(ushort *)((long)__ptr + 2) << 8 | *(ushort *)((long)__ptr + 2) >> 8;
      if (uVar9 == 0x502) {
        bVar8 = 1;
      }
      if ((bool)(uVar9 == 0x606 & bVar8)) {
        std::__cxx11::string::assign((char *)&strName);
        for (uVar10 = 4; (uint)uVar10 < uVar7; uVar10 = (ulong)(byte)((char)uVar10 + 1)) {
          std::operator+(&local_258,&strName,*(char *)((long)__ptr + uVar10));
          std::__cxx11::string::operator=((string *)&strName,(string *)&local_258);
          std::__cxx11::string::~string((string *)&local_258);
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t,&strName
                      );
        if ((_Rb_tree_header *)iVar6._M_node ==
            &gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
             super__Rb_tree_header) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Structure: \"");
          poVar4 = std::operator<<(poVar4,(string *)&strName);
          poVar4 = std::operator<<(poVar4,"\"");
          poVar4 = std::operator<<(poVar4," copying");
          std::endl<char,std::char_traits<char>>(poVar4);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_,&strName);
          arrInt = gsdTime();
          GDSwriteInt(this,0x502,arrInt,0xc);
          bVar1 = false;
          goto LAB_0010c52f;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"Structure: \"");
        poVar4 = std::operator<<(poVar4,(string *)&strName);
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = std::operator<<(poVar4," already copied.");
        bVar1 = false;
        std::endl<char,std::char_traits<char>>(poVar4);
        bVar8 = 0;
      }
      else {
        bVar1 = (bool)(uVar9 == 0x502 | bVar1);
LAB_0010c52f:
        if (bVar8 == 0xff && !bVar1) {
          fwrite(__ptr,1,(ulong)uVar7,(FILE *)this->gdsFile);
          bVar1 = false;
        }
      }
      if (uVar9 == 0x700) {
        bVar8 = 0;
      }
    } while (uVar9 != 0x400);
    operator_delete__(__ptr);
    std::ifstream::close();
    poVar4 = std::operator<<((ostream *)&std::cout,"Copying GDS binaries of \"");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    poVar4 = std::operator<<(poVar4,"\" done.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&strName);
    iVar3 = 0;
  }
  std::ifstream::~ifstream(&gdsFileIn);
  return iVar3;
}

Assistant:

int gdsForge::gdsCopyFile(const string &fileName)
{
  cout << "Copying GDS binaries from \"" << fileName << "\"" << endl;

  ifstream gdsFileIn;

  gdsFileIn.open(fileName, ios::in | ios::binary);

  if (!gdsFileIn.is_open()) {
    cout << "FAILED to open GDS file \"" << fileName << "\"" << endl;
    return 1;
  }

  char *readBlk;
  uint32_t sizeBlk;
  uint32_t hexKey;
  bool cpEN = false;
  bool firstLine = true;
  string strName;
  static set<string> StoredStr;

  gdsFileIn.seekg(0, ios::beg);

  do {
    readBlk = new char[2];
    gdsFileIn.read(readBlk, 2); // Get the size of the record
    sizeBlk = (((unsigned char)readBlk[0] << 8) |
               (unsigned char)readBlk[1]); // Interpret the size of the record

    gdsFileIn.seekg(-2, ios::cur);
    readBlk = new char[sizeBlk]; // Reading in the full length of the record
                                 // excluding the size
    gdsFileIn.read(readBlk, sizeBlk);

    hexKey = (((unsigned char)readBlk[2] << 8) | (unsigned char)readBlk[3]);

    if (hexKey == GDS_BGNSTR) { // Beginning of structure
      cpEN = true;
      firstLine = true;
    }

    if (cpEN && hexKey == GDS_STRNAME) { // get the name of the structure
      strName = "";
      for (uint8_t i = 4; i < sizeBlk; i++) {
        strName = strName + readBlk[i];
      }

      if (StoredStr.find(strName) != StoredStr.end()) { // found
        cout << "Structure: \"" << strName << "\""
             << " already copied." << endl;
        cpEN = false;
      } else { // didnt find
        cout << "Structure: \"" << strName << "\""
             << " copying" << endl;
        StoredStr.insert(strName);
        this->GDSwriteInt(GDS_BGNSTR, gsdTime(), 12);
      }

      firstLine = false;
    }

    if (cpEN && !firstLine) { // Write(copy) the GSD record
      fwrite(readBlk, 1, sizeBlk, this->gdsFile);
    }

    if (hexKey == GDS_ENDSTR) { // end of structure
      cpEN = false;
    }

  } while (hexKey != GDS_ENDLIB);

  delete[] readBlk;

  gdsFileIn.close();
  cout << "Copying GDS binaries of \"" << fileName << "\" done." << endl;
  return 0;
}